

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O2

Odc_Lit_t Odc_And(Odc_Man_t *p,Odc_Lit_t iFan0,Odc_Lit_t iFan1)

{
  Vec_Int_t *p_00;
  ulong uVar1;
  uint uVar2;
  ushort uVar3;
  uint uVar4;
  Odc_Lit_t *pOVar5;
  Odc_Obj_t *pOVar6;
  Odc_Obj_t *pOVar7;
  int iVar8;
  int nCapMin;
  uint uVar9;
  ushort uVar10;
  uint uVar11;
  Odc_Lit_t OVar12;
  undefined8 local_38;
  
  OVar12 = iFan0;
  if ((iFan0 != iFan1) && (OVar12 = 1, (iFan1 ^ iFan0) != 1)) {
    if (iFan0 < 2) {
      OVar12 = 1;
      if (iFan0 == 0) {
        OVar12 = iFan1;
      }
    }
    else if (iFan1 < 2) {
      OVar12 = 1;
      if (iFan1 == 0) {
        OVar12 = iFan0;
      }
    }
    else {
      uVar11 = (uint)iFan1;
      if (iFan1 < iFan0) {
        uVar11 = (uint)iFan0;
      }
      uVar2 = (uint)iFan1;
      if (iFan0 < iFan1) {
        uVar2 = (uint)iFan0;
      }
      uVar3 = (ushort)uVar2;
      uVar10 = (ushort)uVar11;
      if (uVar10 <= uVar3) {
        __assert_fail("iFan0 < iFan1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcOdc.c"
                      ,0x21a,"Odc_Lit_t *Odc_HashLookup(Odc_Man_t *, Odc_Lit_t, Odc_Lit_t)");
      }
      uVar9 = 0x38f;
      if ((uVar2 & 1) == 0) {
        uVar9 = 0;
      }
      uVar4 = 0x161;
      if ((uVar11 & 1) == 0) {
        uVar4 = 0;
      }
      uVar1 = (ulong)(uVar4 ^ uVar9 ^ (uVar2 & 0xfffe) * 0x1f01 ^ (uVar11 & 0xfffe) * 0xb9b) %
              (ulong)(uint)p->nTableSize;
      pOVar5 = p->pTable;
      if (pOVar5[uVar1] == 0) {
        p_00 = p->vUsedSpots;
        iVar8 = p_00->nSize;
        if (iVar8 == p_00->nCap) {
          nCapMin = 0x10;
          if (0xf < iVar8) {
            nCapMin = iVar8 * 2;
          }
          Vec_IntGrow(p_00,nCapMin);
          iVar8 = p_00->nSize;
          pOVar5 = p->pTable;
        }
        p_00->nSize = iVar8 + 1;
        p_00->pArray[iVar8] = (int)uVar1;
      }
      pOVar5 = pOVar5 + uVar1;
      while (*pOVar5 != 0) {
        pOVar6 = Odc_Lit2Obj(p,*pOVar5);
        if ((pOVar6->iFan0 == uVar3) && (pOVar6->iFan1 == uVar10)) {
          if (*pOVar5 != 0) {
            return *pOVar5;
          }
          break;
        }
        pOVar5 = &pOVar6->iNext;
      }
      local_38 = CONCAT44(uVar2,uVar11) & 0xfffe0000fffe;
      iVar8 = p->nObjs;
      if (p->nObjsAlloc <= iVar8) {
        __assert_fail("p->nObjs < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcOdc.c"
                      ,0x77,"Odc_Obj_t *Odc_ObjNew(Odc_Man_t *)");
      }
      pOVar6 = p->pObjs;
      p->nObjs = iVar8 + 1;
      pOVar6[iVar8].iFan0 = uVar3;
      pOVar6[iVar8].iFan1 = uVar10;
      pOVar6[iVar8].iNext = 0;
      pOVar6[iVar8].TravId = 0;
      pOVar7 = Odc_Lit2Obj(p,local_38._4_2_);
      uVar11 = pOVar7->uMask;
      pOVar7 = Odc_Lit2Obj(p,(Odc_Lit_t)local_38);
      pOVar6[iVar8].uMask = uVar11 | pOVar7->uMask;
      OVar12 = (Odc_Lit_t)((uint)(((int)pOVar6 + iVar8 * 0x10) - *(int *)&p->pObjs) >> 3);
      *pOVar5 = OVar12;
    }
  }
  return OVar12;
}

Assistant:

static inline Odc_Lit_t Odc_And( Odc_Man_t * p, Odc_Lit_t iFan0, Odc_Lit_t iFan1 )
{
    Odc_Obj_t * pObj;
    Odc_Lit_t * pEntry;
    unsigned uMask0, uMask1;
    int Temp;
    // consider trivial cases
    if ( iFan0 == iFan1 )
        return iFan0;
    if ( iFan0 == Odc_Not(iFan1) )
        return Odc_Const0();
    if ( Odc_Regular(iFan0) == Odc_Const1() )
        return iFan0 == Odc_Const1() ? iFan1 : Odc_Const0();
    if ( Odc_Regular(iFan1) == Odc_Const1() )
        return iFan1 == Odc_Const1() ? iFan0 : Odc_Const0();
    // canonicize the fanin order
    if ( iFan0 > iFan1 )
        Temp = iFan0, iFan0 = iFan1, iFan1 = Temp;
    // check if a node with these fanins exists
    pEntry = Odc_HashLookup( p, iFan0, iFan1 );
    if ( *pEntry )
        return *pEntry;
    // create a new node
    pObj = Odc_ObjNew( p );
    pObj->iFan0 = iFan0;
    pObj->iFan1 = iFan1;
    pObj->iNext = 0;
    pObj->TravId = 0;
    // set the mask
    uMask0 = Odc_Lit2Obj(p, Odc_Regular(iFan0))->uMask;
    uMask1 = Odc_Lit2Obj(p, Odc_Regular(iFan1))->uMask;
    pObj->uMask = uMask0 | uMask1;
    // add to the table
    *pEntry = Odc_Obj2Lit( p, pObj );
    return *pEntry;
}